

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * nlohmann::json_abi_v3_11_3::detail::exception::name
                   (string *__return_storage_ptr__,string *ename,int id_)

{
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  string local_40;
  
  uVar1 = 0x2e;
  std::__cxx11::to_string(&local_40,id_);
  concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
            (__return_storage_ptr__,(detail *)"[json.exception.",(char (*) [17])ename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffbf,(char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11c597,
             (char (*) [3])CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return concat("[json.exception.", ename, '.', std::to_string(id_), "] ");
    }